

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpChildrenBinary(Node *this,StreamWriterLE *s)

{
  bool bVar1;
  reference this_00;
  Node *child;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> *__range1;
  StreamWriterLE *s_local;
  Node *this_local;
  
  __end1 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::begin
                     (&this->children);
  child = (Node *)std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::end
                            (&this->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
              ::operator*(&__end1);
    DumpBinary(this_00,s);
    __gnu_cxx::
    __normal_iterator<Assimp::FBX::Node_*,_std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void FBX::Node::DumpChildrenBinary(Assimp::StreamWriterLE& s)
{
    for (FBX::Node& child : children) {
        child.DumpBinary(s);
    }
}